

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChMaterialShellReissner.cpp
# Opt level: O3

void __thiscall
chrono::fea::ChElasticityReissnerGeneric::ComputeStress
          (ChElasticityReissnerGeneric *this,ChVector<double> *n_u,ChVector<double> *n_v,
          ChVector<double> *m_u,ChVector<double> *m_v,ChVector<double> *eps_u,
          ChVector<double> *eps_v,ChVector<double> *kur_u,ChVector<double> *kur_v,double z_inf,
          double z_sup,double angle)

{
  uint uVar1;
  uint uVar2;
  ulong uVar3;
  ChVectorN<double,_12> mstrain;
  ChVectorN<double,_12> mstress;
  double local_1c0 [3];
  undefined1 local_1a8 [24];
  undefined1 local_190 [24];
  double local_178;
  double dStack_170;
  double local_168;
  const_blas_data_mapper<double,_long,_0> local_150;
  const_blas_data_mapper<double,_long,_1> *local_140;
  long lStack_138;
  undefined8 uStack_130;
  const_blas_data_mapper<double,_long,_1> *pcStack_128;
  long lStack_120;
  double *pdStack_118;
  double *pdStack_110;
  long lStack_108;
  long lStack_100;
  double *pdStack_f8;
  double *pdStack_f0;
  long lStack_e8;
  const_blas_data_mapper<double,_long,_1> local_e0;
  undefined8 uStack_d0;
  const_blas_data_mapper<double,_long,_1> cStack_c8;
  double *pdStack_b8;
  const_blas_data_mapper<double,_long,_1> cStack_b0;
  long lStack_a0;
  const_blas_data_mapper<double,_long,_1> cStack_98;
  long lStack_88;
  
  memcpy(local_1c0,eps_u,0x18);
  uVar2 = -((uint)((ulong)local_1a8 >> 3) & 0x1fffffff) & 5;
  if (2 < uVar2) {
    uVar2 = 3;
  }
  uVar3 = (ulong)(uVar2 * 8);
  memcpy(local_1a8,eps_v,uVar3);
  if (uVar2 != 3) {
    memcpy(local_1a8 + uVar3,(void *)((long)eps_v->m_data + uVar3),0x18 - uVar3);
  }
  uVar1 = -((uint)((ulong)local_190 >> 3) & 0x1fffffff) & 6;
  uVar2 = 3;
  if (uVar1 < 3) {
    uVar2 = uVar1;
  }
  uVar3 = (ulong)(uVar2 * 8);
  memcpy(local_190,kur_u,uVar3);
  if (uVar2 != 3) {
    memcpy(local_190 + uVar3,(void *)((long)kur_u->m_data + uVar3),0x18 - uVar3);
  }
  local_168 = kur_v->m_data[2];
  local_178 = kur_v->m_data[0];
  dStack_170 = kur_v->m_data[1];
  local_e0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = (double *)&this->mE;
  local_150.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_data = local_1c0;
  local_e0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = 0xc;
  local_150.super_blas_data_mapper<const_double,_long,_0,_0,_1>.m_stride = 1;
  local_140 = (const_blas_data_mapper<double,_long,_1> *)0x0;
  lStack_100 = 0;
  pdStack_f8 = (double *)0x0;
  pdStack_f0 = (double *)0x0;
  lStack_e8 = 0;
  lStack_138 = SUB648(ZEXT864(0),4);
  uStack_130 = 0;
  pcStack_128 = (const_blas_data_mapper<double,_long,_1> *)0x0;
  lStack_120 = lStack_100;
  pdStack_118 = pdStack_f8;
  pdStack_110 = pdStack_f0;
  lStack_108 = lStack_e8;
  Eigen::internal::
  general_matrix_vector_product<long,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_1>,_1,_false,_double,_Eigen::internal::const_blas_data_mapper<double,_long,_0>,_false,_0>
  ::run(0xc,0xc,&local_e0,&local_150,(ResScalar *)&local_140,1,1.0);
  cStack_b0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = pdStack_110;
  cStack_c8.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = lStack_120;
  local_e0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = lStack_138;
  lStack_138 = 3;
  lStack_120 = 0;
  pdStack_110 = (double *)0xc;
  local_e0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = (double *)local_140;
  uStack_d0 = uStack_130;
  cStack_c8.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = (double *)pcStack_128;
  pdStack_b8 = pdStack_118;
  cStack_b0.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = lStack_108;
  lStack_a0 = lStack_100;
  cStack_98.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_data = pdStack_f8;
  cStack_98.super_blas_data_mapper<const_double,_long,_1,_0,_1>.m_stride = (long)pdStack_f0;
  lStack_88 = lStack_e8;
  local_140 = &local_e0;
  pcStack_128 = &local_e0;
  ChVector<double>::operator=
            (n_u,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_140);
  local_140 = &cStack_c8;
  lStack_138 = 3;
  lStack_120 = 3;
  pdStack_110 = (double *)0xc;
  pcStack_128 = &local_e0;
  ChVector<double>::operator=
            (n_v,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_140);
  local_140 = &cStack_b0;
  lStack_138 = 3;
  lStack_120 = 6;
  pdStack_110 = (double *)0xc;
  pcStack_128 = &local_e0;
  ChVector<double>::operator=
            (m_u,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_140);
  local_140 = &cStack_98;
  lStack_138 = 3;
  lStack_120 = 9;
  pdStack_110 = (double *)0xc;
  pcStack_128 = &local_e0;
  ChVector<double>::operator=
            (m_v,(MatrixBase<Eigen::Block<Eigen::Matrix<double,_12,_1,_0,_12,_1>,__1,_1,_false>_> *)
                 &local_140);
  return;
}

Assistant:

void ChElasticityReissnerGeneric::ComputeStress(
	ChVector<>& n_u,          ///< forces along \e u direction (per unit length)
	ChVector<>& n_v,          ///< forces along \e v direction (per unit length)
	ChVector<>& m_u,          ///< torques along \e u direction (per unit length)
	ChVector<>& m_v,          ///< torques along \e v direction (per unit length)
	const ChVector<>& eps_u,  ///< strains along \e u direction
	const ChVector<>& eps_v,  ///< strains along \e v direction
	const ChVector<>& kur_u,  ///< curvature along \e u direction
	const ChVector<>& kur_v,  ///< curvature along \e v direction
	const double z_inf,       ///< layer lower z value (along thickness coord)
	const double z_sup,       ///< layer upper z value (along thickness coord)
	const double angle        ///< layer angle respect to x (if needed) -not used in this, isotropic
) {
	ChVectorN<double, 12> mstrain;
    ChVectorN<double, 12> mstress;
    mstrain.segment(0 , 3) = eps_u.eigen();
	mstrain.segment(3 , 3) = eps_v.eigen();
    mstrain.segment(6 , 3) = kur_u.eigen();
	mstrain.segment(9 , 3) = kur_v.eigen();
    mstress = this->mE * mstrain;
    n_u = mstress.segment(0, 3);
	n_v = mstress.segment(3, 3);
	m_u = mstress.segment(6, 3);
	m_v = mstress.segment(9, 3);
}